

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Type.cxx
# Opt level: O3

int __thiscall Fl_Type::msgnum(Fl_Type *this)

{
  int iVar1;
  Fl_Type *pFVar2;
  int iVar3;
  Fl_Type *pFVar4;
  
  iVar3 = 0;
  pFVar4 = this;
  do {
    iVar3 = (iVar3 + 1) - (uint)(pFVar4->label_ == (char *)0x0);
    if (pFVar4 != this) {
      iVar1 = (*pFVar4->_vptr_Fl_Type[0x17])(pFVar4);
      if (iVar1 != 0) {
        iVar3 = (iVar3 + 1) - (uint)(pFVar4[1].user_data_type_ == (char *)0x0);
      }
    }
    pFVar2 = pFVar4->prev;
    if (pFVar2 == (Fl_Type *)0x0) {
      pFVar2 = pFVar4->parent;
    }
    pFVar4 = pFVar2;
  } while (pFVar2 != (Fl_Type *)0x0);
  return iVar3;
}

Assistant:

int
Fl_Type::msgnum() {
  int		count;
  Fl_Type	*p;

  for (count = 0, p = this; p;) {
    if (p->label()) count ++;
    if (p != this && p->is_widget() && ((Fl_Widget_Type *)p)->tooltip()) count ++;

    if (p->prev) p = p->prev;
    else p = p->parent;
  }

  return count;
}